

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ssl_ignore_data(us_internal_ssl_socket_t *s)

{
  us_loop_t *loop_00;
  void *pvVar1;
  long lVar2;
  int iVar3;
  longlong lVar4;
  long in_RDI;
  loop_ssl_data *loop_ssl_data;
  us_loop_t *loop;
  int local_4;
  
  iVar3 = SSL_in_init(*(undefined8 *)(in_RDI + 0x30));
  if (iVar3 == 0) {
    local_4 = 0;
  }
  else {
    loop_00 = (us_loop_t *)**(undefined8 **)(in_RDI + 0x10);
    pvVar1 = (loop_00->data).ssl_data;
    lVar2 = *(long *)((long)pvVar1 + 0x28);
    lVar4 = us_loop_iteration_number(loop_00);
    if (lVar2 != lVar4) {
      lVar4 = us_loop_iteration_number(loop_00);
      *(longlong *)((long)pvVar1 + 0x28) = lVar4;
      *(undefined4 *)((long)pvVar1 + 0x30) = 5;
    }
    if (*(int *)((long)pvVar1 + 0x30) == 0) {
      local_4 = 1;
    }
    else {
      *(int *)((long)pvVar1 + 0x30) = *(int *)((long)pvVar1 + 0x30) + -1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ssl_ignore_data(struct us_internal_ssl_socket_t *s) {

    // fast path just checks for init
    if (!SSL_in_init(s->ssl)) {
        return 0;
    }

    // this path is run for all ssl sockets that are in init and just got data event from polling

    struct us_loop_t *loop = s->s.context->loop;
    struct loop_ssl_data *loop_ssl_data = loop->data.ssl_data;

    // reset handshake budget if new iteration
    if (loop_ssl_data->last_iteration_nr != us_loop_iteration_number(loop)) {
        loop_ssl_data->last_iteration_nr = us_loop_iteration_number(loop);
        loop_ssl_data->handshake_budget = MAX_HANDSHAKES_PER_LOOP_ITERATION;
    }

    if (loop_ssl_data->handshake_budget) {
        loop_ssl_data->handshake_budget--;
        return 0;
    }

    // ignore this data event
    return 1;
}